

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O0

void duckdb::ListFixedSizeAppend::Append<unsigned_long>
               (SegmentStatistics *stats,data_ptr_t target,idx_t target_offset,
               UnifiedVectorFormat *adata,idx_t offset,idx_t count)

{
  unsigned_long *puVar1;
  idx_t iVar2;
  UnifiedVectorFormat *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_R8;
  ulong in_R9;
  idx_t target_idx;
  idx_t source_idx;
  idx_t i;
  uint64_t *tdata;
  unsigned_long *sdata;
  ulong local_48;
  
  puVar1 = UnifiedVectorFormat::GetData<unsigned_long>(in_RCX);
  for (local_48 = 0; local_48 < in_R9; local_48 = local_48 + 1) {
    iVar2 = SelectionVector::get_index(in_RCX->sel,in_R8 + local_48);
    *(unsigned_long *)(in_RSI + (in_RDX + local_48) * 8) = puVar1[iVar2];
  }
  return;
}

Assistant:

static void Append(SegmentStatistics &stats, data_ptr_t target, idx_t target_offset, UnifiedVectorFormat &adata,
	                   idx_t offset, idx_t count) {
		auto sdata = UnifiedVectorFormat::GetData<uint64_t>(adata);
		auto tdata = reinterpret_cast<uint64_t *>(target);
		for (idx_t i = 0; i < count; i++) {
			auto source_idx = adata.sel->get_index(offset + i);
			auto target_idx = target_offset + i;
			tdata[target_idx] = sdata[source_idx];
		}
	}